

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

void __thiscall
Filter::Filter(Filter *this,int input_size,int output_size,double *learning_rate,string *type)

{
  double *__ptr;
  double dVar1;
  Index IVar2;
  Index IVar3;
  bool bVar4;
  int iVar5;
  Clock *pCVar6;
  int local_88;
  int local_84;
  double *local_80;
  Index local_78;
  Index IStack_70;
  string filterType;
  string cutoffFreq;
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR_forward_00135970;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->filter).coeff.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter).coeff.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter).coeff.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter).freq.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter).freq.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter).freq.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter).buff.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter).buff.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter).buff.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  pCVar6 = Clock::getInstance();
  this->clock = pCVar6;
  std::__cxx11::string::find((char)type,0x2c);
  std::__cxx11::string::substr((ulong)&filterType,(ulong)type);
  std::__cxx11::string::substr((ulong)&cutoffFreq,(ulong)type);
  iVar5 = std::__cxx11::stoi(&cutoffFreq,(size_t *)0x0,10);
  dVar1 = Clock::getDt(this->clock);
  local_88 = 1;
  local_84 = local_88;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_80,&local_84,&local_88);
  dVar1 = (double)iVar5 / (1.0 / dVar1);
  __ptr = (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data;
  (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_80;
  IVar2 = (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  IVar3 = (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_78;
  (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       IStack_70;
  local_80 = __ptr;
  local_78 = IVar2;
  IStack_70 = IVar3;
  free(__ptr);
  bVar4 = std::operator==(&filterType,"lowpass");
  if (bVar4) {
    FIR::lowpass(&this->filter,2000,dVar1);
  }
  else {
    bVar4 = std::operator==(&filterType,"highpass");
    if (bVar4) {
      FIR::highpass(&this->filter,2000,dVar1);
    }
  }
  std::__cxx11::string::~string((string *)&cutoffFreq);
  std::__cxx11::string::~string((string *)&filterType);
  return;
}

Assistant:

Filter::Filter(int input_size, int output_size, double* learning_rate, string type) {
    clock = Clock::getInstance();
    int pos = type.find_first_of(',');
    string filterType = type.substr(0, pos);
    string cutoffFreq = type.substr(pos+1);
    double normalizedFreq = stoi(cutoffFreq) / (1.0 / clock->getDt());
    output = Eigen::MatrixXd(1, 1);
    if(filterType == "lowpass") {
        filter.lowpass(2000, normalizedFreq);
    }
    else if(filterType == "highpass") {
        filter.highpass(2000, normalizedFreq);
    }
}